

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_4xx_tlbwe_hi_ppc
               (CPUPPCState_conflict *env,target_ulong_conflict entry,target_ulong_conflict val)

{
  int iVar1;
  int iVar2;
  ppc6xx_tlb_t_conflict *ppVar3;
  uint uVar4;
  target_ulong_conflict tVar5;
  CPUState_conflict *cpu;
  uint local_2c;
  target_ulong_conflict end;
  target_ulong_conflict page;
  ppcemb_tlb_t_conflict *tlb;
  CPUState_conflict *cs;
  target_ulong_conflict val_local;
  target_ulong_conflict entry_local;
  CPUPPCState_conflict *env_local;
  
  cpu = env_cpu(env);
  uVar4 = entry & 0x3f;
  ppVar3 = (env->tlb).tlb6;
  if ((*(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x14) & 8) != 0) {
    iVar1 = *(int *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 8);
    iVar2 = *(int *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x10);
    for (local_2c = *(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 8);
        local_2c < (uint)(iVar1 + iVar2); local_2c = local_2c + 0x1000) {
      tlb_flush_page_ppc(cpu,local_2c);
    }
  }
  tVar5 = booke_tlb_to_page_size(val >> 7 & 7);
  *(target_ulong_conflict *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x10) = tVar5;
  if (((val & 0x40) != 0) && (*(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x10) < 0x1000)) {
    cpu_abort_ppc(cpu,
                  "TLB size %u < %u are not supported (%d)\nPlease implement TARGET_PAGE_BITS_VARY\n"
                  ,(ulong)*(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x10),0x1000,
                  (ulong)(val >> 7 & 7));
  }
  *(target_ulong_conflict *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 8) =
       val & (*(int *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x10) - 1U ^ 0xffffffff);
  if ((val & 0x40) == 0) {
    *(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x14) =
         *(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x14) & 0xfffffff7;
  }
  else {
    *(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x14) =
         *(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x14) | 8;
    if ((val & 0x20) != 0) {
      cpu_abort_ppc(cpu,"Little-endian TLB entries are not supported by now\n");
    }
  }
  *(target_ulong_conflict *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0xc) = env->spr[0x3b1];
  if ((*(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x14) & 8) != 0) {
    iVar1 = *(int *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 8);
    iVar2 = *(int *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 0x10);
    for (local_2c = *(uint *)((long)ppVar3 + (ulong)uVar4 * 0x20 + 8);
        local_2c < (uint)(iVar1 + iVar2); local_2c = local_2c + 0x1000) {
      tlb_flush_page_ppc(cpu,local_2c);
    }
  }
  return;
}

Assistant:

void helper_4xx_tlbwe_hi(CPUPPCState *env, target_ulong entry,
                         target_ulong val)
{
    CPUState *cs = env_cpu(env);
    ppcemb_tlb_t *tlb;
    target_ulong page, end;

    LOG_SWTLB("%s entry %d val " TARGET_FMT_lx "\n", __func__, (int)entry,
              val);
    entry &= PPC4XX_TLB_ENTRY_MASK;
    tlb = &env->tlb.tlbe[entry];
    /* Invalidate previous TLB (if it's valid) */
    if (tlb->prot & PAGE_VALID) {
        end = tlb->EPN + tlb->size;
        LOG_SWTLB("%s: invalidate old TLB %d start " TARGET_FMT_lx " end "
                  TARGET_FMT_lx "\n", __func__, (int)entry, tlb->EPN, end);
        for (page = tlb->EPN; page < end; page += TARGET_PAGE_SIZE) {
            tlb_flush_page(cs, page);
        }
    }
    tlb->size = booke_tlb_to_page_size((val >> PPC4XX_TLBHI_SIZE_SHIFT)
                                       & PPC4XX_TLBHI_SIZE_MASK);
    /*
     * We cannot handle TLB size < TARGET_PAGE_SIZE.
     * If this ever occurs, we should implement TARGET_PAGE_BITS_VARY
     */
    if ((val & PPC4XX_TLBHI_V) && tlb->size < TARGET_PAGE_SIZE) {
        cpu_abort(cs, "TLB size " TARGET_FMT_lu " < %u "
                  "are not supported (%d)\n"
                  "Please implement TARGET_PAGE_BITS_VARY\n",
                  tlb->size, TARGET_PAGE_SIZE, (int)((val >> 7) & 0x7));
    }
    tlb->EPN = val & ~(tlb->size - 1);
    if (val & PPC4XX_TLBHI_V) {
        tlb->prot |= PAGE_VALID;
        if (val & PPC4XX_TLBHI_E) {
            /* XXX: TO BE FIXED */
            cpu_abort(cs,
                      "Little-endian TLB entries are not supported by now\n");
        }
    } else {
        tlb->prot &= ~PAGE_VALID;
    }
    tlb->PID = env->spr[SPR_40x_PID]; /* PID */
    LOG_SWTLB("%s: set up TLB %d RPN " TARGET_FMT_plx " EPN " TARGET_FMT_lx
              " size " TARGET_FMT_lx " prot %c%c%c%c PID %d\n", __func__,
              (int)entry, tlb->RPN, tlb->EPN, tlb->size,
              tlb->prot & PAGE_READ ? 'r' : '-',
              tlb->prot & PAGE_WRITE ? 'w' : '-',
              tlb->prot & PAGE_EXEC ? 'x' : '-',
              tlb->prot & PAGE_VALID ? 'v' : '-', (int)tlb->PID);
    /* Invalidate new TLB (if valid) */
    if (tlb->prot & PAGE_VALID) {
        end = tlb->EPN + tlb->size;
        LOG_SWTLB("%s: invalidate TLB %d start " TARGET_FMT_lx " end "
                  TARGET_FMT_lx "\n", __func__, (int)entry, tlb->EPN, end);
        for (page = tlb->EPN; page < end; page += TARGET_PAGE_SIZE) {
            tlb_flush_page(cs, page);
        }
    }
}